

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_8::readTileData
               (InputStreamMutex *streamData,Data *ifd,int dx,int dy,int lx,int ly,char **buffer,
               int *dataSize)

{
  bool bVar1;
  int iVar2;
  Int64 *pIVar3;
  ostream *poVar4;
  InputExc *pIVar5;
  Int64 IVar6;
  ArgExc *this;
  ulong uVar7;
  undefined8 uVar8;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 *in_stack_00000008;
  int *in_stack_00000010;
  stringstream _iex_throw_s_1;
  int partNumber;
  int levelY;
  int levelX;
  int tileYCoord;
  int tileXCoord;
  stringstream _iex_throw_s;
  Int64 tileOffset;
  int *in_stack_fffffffffffffc08;
  IStream *in_stack_fffffffffffffc10;
  undefined8 in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc20;
  TileOffsets *in_stack_fffffffffffffc28;
  stringstream local_358 [16];
  ostream local_348 [376];
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  Int64 local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  long local_8;
  
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pIVar3 = TileOffsets::operator()
                     (in_stack_fffffffffffffc28,(int)((ulong)in_stack_fffffffffffffc20 >> 0x20),
                      (int)in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20)
                      ,(int)in_stack_fffffffffffffc18);
  local_28 = *pIVar3;
  if (local_28 == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar4 = std::operator<<(local_1a0,"Tile (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_18);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1c);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_20);
    std::operator<<(poVar4,") is missing.");
    pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar5,local_1b0);
    __cxa_throw(pIVar5,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  bVar1 = isMultiPart(*(int *)(local_10 + 0x70));
  if (bVar1) {
    IVar6 = (**(code **)(**(long **)(local_8 + 0x28) + 0x28))();
    if (IVar6 != local_28) {
      (**(code **)(**(long **)(local_8 + 0x28) + 0x30))(*(long **)(local_8 + 0x28),local_28);
    }
  }
  else if (*(Int64 *)(local_8 + 0x30) != local_28) {
    (**(code **)(**(long **)(local_8 + 0x28) + 0x30))(*(long **)(local_8 + 0x28),local_28);
  }
  bVar1 = isMultiPart(*(int *)(local_10 + 0x70));
  if ((bVar1) &&
     (Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08),
     local_1d0 != *(int *)(local_10 + 0x130))) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_358);
    poVar4 = std::operator<<(local_348,"Unexpected part number ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1d0);
    poVar4 = std::operator<<(poVar4,", should be ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(local_10 + 0x130));
    std::operator<<(poVar4,".");
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this,local_358);
    __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08)
  ;
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08)
  ;
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08)
  ;
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08)
  ;
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08)
  ;
  if (local_1c0 != local_14) {
    pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar5,"Unexpected tile x coordinate.");
    __cxa_throw(pIVar5,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  if (local_1c4 == local_18) {
    if (local_1c8 != local_1c) {
      pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(pIVar5,"Unexpected tile x level number coordinate.");
      __cxa_throw(pIVar5,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    if (local_1cc == local_20) {
      if ((-1 < *in_stack_00000010) &&
         (*in_stack_00000010 <= (int)*(undefined8 *)(local_10 + 0x160))) {
        uVar7 = (**(code **)(**(long **)(local_8 + 0x28) + 0x10))();
        if ((uVar7 & 1) == 0) {
          (**(code **)(**(long **)(local_8 + 0x28) + 0x18))
                    (*(long **)(local_8 + 0x28),*in_stack_00000008,*in_stack_00000010);
        }
        else {
          uVar8 = (**(code **)(**(long **)(local_8 + 0x28) + 0x20))
                            (*(long **)(local_8 + 0x28),*in_stack_00000010);
          *in_stack_00000008 = uVar8;
        }
        iVar2 = Xdr::size<int>();
        *(Int64 *)(local_8 + 0x30) = local_28 + (long)(iVar2 * 5) + (long)*in_stack_00000010;
        return;
      }
      pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(pIVar5,"Unexpected tile block length.");
      __cxa_throw(pIVar5,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar5,"Unexpected tile y level number coordinate.");
    __cxa_throw(pIVar5,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  pIVar5 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(pIVar5,"Unexpected tile y coordinate.");
  __cxa_throw(pIVar5,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

void
readTileData (InputStreamMutex *streamData,
              TiledInputFile::Data *ifd,
	      int dx, int dy,
	      int lx, int ly,
              char *&buffer,
              int &dataSize)
{
    //
    // Read a single tile block from the file and into the array pointed
    // to by buffer.  If the file is memory-mapped, then we change where
    // buffer points instead of writing into the array (hence buffer needs
    // to be a reference to a char *).
    //

    //
    // Look up the location for this tile in the Index and
    // seek to that position if necessary
    //
    
    Int64 tileOffset = ifd->tileOffsets (dx, dy, lx, ly);

    if (tileOffset == 0)
    {
        THROW (IEX_NAMESPACE::InputExc, "Tile (" << dx << ", " << dy << ", " <<
			      lx << ", " << ly << ") is missing.");
    }


    //
    // In a multi-part file, the next chunk does not need to
    // belong to the same part, so we have to compare the
    // offset here.
    //

    if (!isMultiPart(ifd->version))
    {
        if (streamData->currentPosition != tileOffset)
            streamData->is->seekg (tileOffset);
    }
    else
    {
        //
        // In a multi-part file, the file pointer may be moved by other
        // parts, so we have to ask tellg() where we are.
        //
        if (streamData->is->tellg() != tileOffset)
            streamData->is->seekg (tileOffset);
    }

    //
    // Read the first few bytes of the tile (the header).
    // Verify that the tile coordinates and the level number
    // are correct.
    //
    
    int tileXCoord, tileYCoord, levelX, levelY;

    if (isMultiPart(ifd->version))
    {
        int partNumber;
        Xdr::read <StreamIO> (*streamData->is, partNumber);
        if (partNumber != ifd->partNumber)
        {
            THROW (IEX_NAMESPACE::ArgExc, "Unexpected part number " << partNumber
                   << ", should be " << ifd->partNumber << ".");
        }
    }

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, tileXCoord);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, tileYCoord);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, levelX);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, levelY);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, dataSize);

    if (tileXCoord != dx)
        throw IEX_NAMESPACE::InputExc ("Unexpected tile x coordinate.");

    if (tileYCoord != dy)
        throw IEX_NAMESPACE::InputExc ("Unexpected tile y coordinate.");

    if (levelX != lx)
        throw IEX_NAMESPACE::InputExc ("Unexpected tile x level number coordinate.");

    if (levelY != ly)
        throw IEX_NAMESPACE::InputExc ("Unexpected tile y level number coordinate.");

    if (dataSize < 0 || dataSize > static_cast<int>(ifd->tileBufferSize) )
        throw IEX_NAMESPACE::InputExc ("Unexpected tile block length.");

    //
    // Read the pixel data.
    //

    if (streamData->is->isMemoryMapped ())
        buffer = streamData->is->readMemoryMapped (dataSize);
    else
        streamData->is->read (buffer, dataSize);

    //
    // Keep track of which tile is the next one in
    // the file, so that we can avoid redundant seekg()
    // operations (seekg() can be fairly expensive).
    //
    
    streamData->currentPosition = tileOffset + 5 * Xdr::size<int>() + dataSize;
}